

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::WindowExpression::
ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>
          (string *__return_storage_ptr__,WindowExpression *this,WindowExpression *entry,
          string *schema,string *function_name)

{
  pointer pOVar1;
  pointer pOVar2;
  pointer puVar3;
  pointer puVar4;
  anon_class_8_1_2b093797 f;
  pointer pPVar5;
  InternalException *pIVar6;
  string *psVar7;
  WindowBoundary in_R9B;
  undefined7 in_register_00000089;
  long lVar8;
  string units;
  string sep;
  string to;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string from;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar8._0_1_ = (entry->super_ParsedExpression).super_BaseExpression.type;
  lVar8._1_1_ = (entry->super_ParsedExpression).super_BaseExpression.expression_class;
  lVar8._2_6_ = *(undefined6 *)&(entry->super_ParsedExpression).super_BaseExpression.field_0xa;
  if (lVar8 == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)schema);
  }
  else {
    ::std::operator+(&sep,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry
                     ,".");
    ::std::operator+(__return_storage_ptr__,&sep,schema);
    ::std::__cxx11::string::~string((string *)&sep);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  lVar8 = (long)(this->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    from._M_dataplus._M_p =
         (pointer)(CONCAT44(from._M_dataplus._M_p._4_4_,(uint)this->distinct) ^ 1);
    ::std::__cxx11::string::string((string *)&units,", ",(allocator *)&to);
    f.distincts._1_7_ = in_register_00000089;
    f.distincts._0_1_ = in_R9B;
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>(duckdb::WindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_1_>
              (&sep,(StringUtil *)&this->children,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)(lVar8 >> 3),(unsigned_long)&units,&from,f);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
    ::std::__cxx11::string::~string((string *)&units);
  }
  if ((this->offset_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->offset_expr);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(&sep,pPVar5);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
  }
  if ((this->default_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->default_expr);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(&sep,pPVar5);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
  }
  if ((this->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pOVar1 = (this->arg_orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pOVar2 = (this->arg_orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::string((string *)&units,", ",(allocator *)&from);
    StringUtil::
    Join<duckdb::vector<duckdb::OrderByNode,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>(duckdb::WindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::OrderByNode_const&)_1_>
              (&sep,(StringUtil *)&this->arg_orders,(long)pOVar2 - (long)pOVar1 >> 4,&units);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
    ::std::__cxx11::string::~string((string *)&units);
  }
  if (this->ignore_nulls == true) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->filter_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->filter_expr);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(&units,pPVar5);
    ::std::operator+(&sep,") FILTER (WHERE ",&units);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&sep);
    ::std::__cxx11::string::~string((string *)&units);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  sep._M_dataplus._M_p = (pointer)&sep.field_2;
  sep._M_string_length = 0;
  sep.field_2._M_local_buf[0] = '\0';
  if ((this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar3 = (this->partitions).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->partitions).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::string((string *)&from,", ",(allocator *)&to);
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>(duckdb::WindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_2_>
              (&units,(StringUtil *)&this->partitions,(long)puVar4 - (long)puVar3 >> 3,&from);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&units);
    ::std::__cxx11::string::~string((string *)&from);
    ::std::__cxx11::string::assign((char *)&sep);
  }
  if ((this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pOVar1 = (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pOVar2 = (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::string((string *)&from,", ",(allocator *)&to);
    StringUtil::
    Join<duckdb::vector<duckdb::OrderByNode,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>(duckdb::WindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::OrderByNode_const&)_2_>
              (&units,(StringUtil *)&this->orders,(long)pOVar2 - (long)pOVar1 >> 4,&from);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&units);
    ::std::__cxx11::string::~string((string *)&from);
    ::std::__cxx11::string::assign((char *)&sep);
  }
  ::std::__cxx11::string::string((string *)&units,"ROWS",(allocator *)&from);
  from._M_dataplus._M_p = (pointer)&from.field_2;
  from._M_string_length = 0;
  from.field_2._M_local_buf[0] = '\0';
  switch(this->start) {
  case INVALID:
  case UNBOUNDED_FOLLOWING:
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&to,"Unrecognized FROM in WindowExpression",(allocator *)&local_90);
    InternalException::InternalException(pIVar6,&to);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case UNBOUNDED_PRECEDING:
    if (this->end != CURRENT_ROW_RANGE) {
      ::std::__cxx11::string::assign((char *)&from);
    }
    goto switchD_006413cf_default;
  case CURRENT_ROW_RANGE:
  case CURRENT_ROW_ROWS:
  case CURRENT_ROW_GROUPS:
    ::std::__cxx11::string::assign((char *)&from);
    ToUnits_abi_cxx11_(&to,(WindowExpression *)(ulong)this->start,CURRENT_ROW_ROWS,CURRENT_ROW_RANGE
                       ,CURRENT_ROW_GROUPS,in_R9B);
    break;
  case EXPR_PRECEDING_ROWS:
  case EXPR_PRECEDING_RANGE:
  case EXPR_PRECEDING_GROUPS:
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->start_expr);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pPVar5);
    ::std::operator+(&to,&local_90," PRECEDING");
    ::std::__cxx11::string::operator=((string *)&from,(string *)&to);
    ::std::__cxx11::string::~string((string *)&to);
    ::std::__cxx11::string::~string((string *)&local_90);
    ToUnits_abi_cxx11_(&to,(WindowExpression *)(ulong)this->start,EXPR_PRECEDING_ROWS,
                       EXPR_PRECEDING_RANGE,EXPR_PRECEDING_GROUPS,in_R9B);
    break;
  case EXPR_FOLLOWING_ROWS:
  case EXPR_FOLLOWING_RANGE:
  case EXPR_FOLLOWING_GROUPS:
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->start_expr);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pPVar5);
    ::std::operator+(&to,&local_90," FOLLOWING");
    ::std::__cxx11::string::operator=((string *)&from,(string *)&to);
    ::std::__cxx11::string::~string((string *)&to);
    ::std::__cxx11::string::~string((string *)&local_90);
    ToUnits_abi_cxx11_(&to,(WindowExpression *)(ulong)this->start,EXPR_FOLLOWING_ROWS,
                       EXPR_FOLLOWING_RANGE,EXPR_FOLLOWING_GROUPS,in_R9B);
    break;
  default:
    goto switchD_006413cf_default;
  }
  ::std::__cxx11::string::operator=((string *)&units,(string *)&to);
  ::std::__cxx11::string::~string((string *)&to);
switchD_006413cf_default:
  to._M_dataplus._M_p = (pointer)&to.field_2;
  to._M_string_length = 0;
  to.field_2._M_local_buf[0] = '\0';
  if (EXPR_FOLLOWING_GROUPS < this->end) goto LAB_006416db;
  psVar7 = &to;
  switch(this->end) {
  case INVALID:
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_90,"Unrecognized TO in WindowExpression",(allocator *)&local_50);
    InternalException::InternalException(pIVar6,&local_90);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case UNBOUNDED_PRECEDING:
    break;
  case UNBOUNDED_FOLLOWING:
    break;
  case CURRENT_ROW_RANGE:
    if (this->start == UNBOUNDED_PRECEDING) goto LAB_006416db;
    ::std::__cxx11::string::assign((char *)psVar7);
    psVar7 = &units;
    break;
  case CURRENT_ROW_ROWS:
  case CURRENT_ROW_GROUPS:
    ::std::__cxx11::string::assign((char *)psVar7);
    ToUnits_abi_cxx11_(&local_90,(WindowExpression *)(ulong)this->end,CURRENT_ROW_ROWS,
                       CURRENT_ROW_RANGE,CURRENT_ROW_GROUPS,in_R9B);
    goto LAB_00641661;
  default:
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->end_expr);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar5);
    ::std::operator+(&local_90,&local_50," PRECEDING");
    ::std::__cxx11::string::operator=((string *)&to,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
    ToUnits_abi_cxx11_(&local_90,(WindowExpression *)(ulong)this->end,EXPR_PRECEDING_ROWS,
                       EXPR_PRECEDING_RANGE,EXPR_PRECEDING_GROUPS,in_R9B);
    goto LAB_00641661;
  case EXPR_FOLLOWING_ROWS:
  case EXPR_FOLLOWING_RANGE:
  case EXPR_FOLLOWING_GROUPS:
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->end_expr);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar5);
    ::std::operator+(&local_90,&local_50," FOLLOWING");
    ::std::__cxx11::string::operator=((string *)&to,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
    ToUnits_abi_cxx11_(&local_90,(WindowExpression *)(ulong)this->end,EXPR_FOLLOWING_ROWS,
                       EXPR_FOLLOWING_RANGE,EXPR_FOLLOWING_GROUPS,in_R9B);
LAB_00641661:
    ::std::__cxx11::string::operator=((string *)&units,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    goto LAB_006416db;
  }
  ::std::__cxx11::string::assign((char *)psVar7);
LAB_006416db:
  if (this->exclude_clause != NO_OTHER) {
    if (from._M_string_length == 0) {
      ::std::__cxx11::string::assign((char *)&from);
    }
    if (to._M_string_length == 0) {
      ::std::__cxx11::string::assign((char *)&to);
      ::std::__cxx11::string::assign((char *)&units);
    }
  }
  if (to._M_string_length == 0 && from._M_string_length == 0) goto LAB_006417de;
  ::std::operator+(&local_90,&sep,&units);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_90);
  if (from._M_string_length == 0) {
    if (to._M_string_length == 0) goto LAB_006417de;
LAB_006417b5:
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    if (to._M_string_length != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      goto LAB_006417b5;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_006417de:
  if ((this->exclude_clause != NO_OTHER) &&
     (::std::__cxx11::string::append((char *)__return_storage_ptr__),
     (byte)(this->exclude_clause - CURRENT_ROW) < 3)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&to);
  ::std::__cxx11::string::~string((string *)&from);
  ::std::__cxx11::string::~string((string *)&units);
  ::std::__cxx11::string::~string((string *)&sep);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry, const string &schema, const string &function_name) {
		// Start with function call
		string result = schema.empty() ? function_name : schema + "." + function_name;
		result += "(";
		if (entry.children.size()) {
			//	Only one DISTINCT is allowed (on the first argument)
			int distincts = entry.distinct ? 0 : 1;
			result += StringUtil::Join(entry.children, entry.children.size(), ", ", [&](const unique_ptr<BASE> &child) {
				return (distincts++ ? "" : "DISTINCT ") + child->ToString();
			});
		}
		// Lead/Lag extra arguments
		if (entry.offset_expr.get()) {
			result += ", ";
			result += entry.offset_expr->ToString();
		}
		if (entry.default_expr.get()) {
			result += ", ";
			result += entry.default_expr->ToString();
		}
		// ORDER BY arguments
		if (!entry.arg_orders.empty()) {
			result += " ORDER BY ";
			result += StringUtil::Join(entry.arg_orders, entry.arg_orders.size(), ", ",
			                           [](const ORDER_NODE &order) { return order.ToString(); });
		}

		// IGNORE NULLS
		if (entry.ignore_nulls) {
			result += " IGNORE NULLS";
		}
		// FILTER
		if (entry.filter_expr) {
			result += ") FILTER (WHERE " + entry.filter_expr->ToString();
		}

		// Over clause
		result += ") OVER (";
		string sep;

		// Partitions
		if (!entry.partitions.empty()) {
			result += "PARTITION BY ";
			result += StringUtil::Join(entry.partitions, entry.partitions.size(), ", ",
			                           [](const unique_ptr<BASE> &partition) { return partition->ToString(); });
			sep = " ";
		}

		// Orders
		if (!entry.orders.empty()) {
			result += sep;
			result += "ORDER BY ";
			result += StringUtil::Join(entry.orders, entry.orders.size(), ", ",
			                           [](const ORDER_NODE &order) { return order.ToString(); });
			sep = " ";
		}

		// Rows/Range
		string units = "ROWS";
		string from;
		switch (entry.start) {
		case WindowBoundary::CURRENT_ROW_RANGE:
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			from = "CURRENT ROW";
			units = ToUnits(entry.start, WindowBoundary::CURRENT_ROW_ROWS, WindowBoundary::CURRENT_ROW_RANGE,
			                WindowBoundary::CURRENT_ROW_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
			if (entry.end != WindowBoundary::CURRENT_ROW_RANGE) {
				from = "UNBOUNDED PRECEDING";
			}
			break;
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_PRECEDING_RANGE:
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			from = entry.start_expr->ToString() + " PRECEDING";
			units = ToUnits(entry.start, WindowBoundary::EXPR_PRECEDING_ROWS, WindowBoundary::EXPR_PRECEDING_RANGE,
			                WindowBoundary::EXPR_PRECEDING_GROUPS);
			break;
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			from = entry.start_expr->ToString() + " FOLLOWING";
			units = ToUnits(entry.start, WindowBoundary::EXPR_FOLLOWING_ROWS, WindowBoundary::EXPR_FOLLOWING_RANGE,
			                WindowBoundary::EXPR_FOLLOWING_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_FOLLOWING:
		case WindowBoundary::INVALID:
			throw InternalException("Unrecognized FROM in WindowExpression");
		}

		string to;
		switch (entry.end) {
		case WindowBoundary::CURRENT_ROW_RANGE:
			if (entry.start != WindowBoundary::UNBOUNDED_PRECEDING) {
				to = "CURRENT ROW";
				units = "RANGE";
			}
			break;
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			to = "CURRENT ROW";
			units = ToUnits(entry.end, WindowBoundary::CURRENT_ROW_ROWS, WindowBoundary::CURRENT_ROW_RANGE,
			                WindowBoundary::CURRENT_ROW_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
			to = "UNBOUNDED PRECEDING";
			break;
		case WindowBoundary::UNBOUNDED_FOLLOWING:
			to = "UNBOUNDED FOLLOWING";
			break;
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_PRECEDING_RANGE:
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			to = entry.end_expr->ToString() + " PRECEDING";
			units = ToUnits(entry.end, WindowBoundary::EXPR_PRECEDING_ROWS, WindowBoundary::EXPR_PRECEDING_RANGE,
			                WindowBoundary::EXPR_PRECEDING_GROUPS);
			break;
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			to = entry.end_expr->ToString() + " FOLLOWING";
			units = ToUnits(entry.end, WindowBoundary::EXPR_FOLLOWING_ROWS, WindowBoundary::EXPR_FOLLOWING_RANGE,
			                WindowBoundary::EXPR_FOLLOWING_GROUPS);
			break;
		case WindowBoundary::INVALID:
			throw InternalException("Unrecognized TO in WindowExpression");
		}
		if (entry.exclude_clause != WindowExcludeMode::NO_OTHER) {
			// if we have an explicit EXCLUDE we always need to fill in from/to
			if (from.empty()) {
				from = "UNBOUNDED PRECEDING";
			}
			if (to.empty()) {
				to = "CURRENT ROW";
				units = "RANGE";
			}
		}

		if (!from.empty() || !to.empty()) {
			result += sep + units;
		}
		if (!from.empty() && !to.empty()) {
			result += " BETWEEN ";
			result += from;
			result += " AND ";
			result += to;
		} else if (!from.empty()) {
			result += " ";
			result += from;
		} else if (!to.empty()) {
			result += " ";
			result += to;
		}

		if (entry.exclude_clause != WindowExcludeMode::NO_OTHER) {
			result += " EXCLUDE ";
		}
		switch (entry.exclude_clause) {
		case WindowExcludeMode::CURRENT_ROW:
			result += "CURRENT ROW";
			break;
		case WindowExcludeMode::GROUP:
			result += "GROUP";
			break;
		case WindowExcludeMode::TIES:
			result += "TIES";
			break;
		default:
			break;
		}

		result += ")";

		return result;
	}